

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_*>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_*>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>
::operator=(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_*>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>
            *this,raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_*>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>
                  *that)

{
  size_t sVar1;
  size_t sVar2;
  MaybeInitializedPtr MVar3;
  
  destructor_impl(this);
  is_full_soo(that);
  sVar1 = (that->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  sVar2 = (that->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_;
  MVar3 = (that->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          heap_or_soo_.heap.slot_array;
  (this->settings_).
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control =
       (that->settings_).
       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
       .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
       heap_or_soo_.heap.control;
  (this->settings_).
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = MVar3;
  (this->settings_).
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       sVar1;
  (this->settings_).
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
       sVar2;
  (that->settings_).
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  (that->settings_).
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<void_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  return this;
}

Assistant:

raw_hash_set& operator=(raw_hash_set&& that) noexcept(
      absl::allocator_traits<allocator_type>::is_always_equal::value &&
      std::is_nothrow_move_assignable<hasher>::value &&
      std::is_nothrow_move_assignable<key_equal>::value) {
    // TODO(sbenza): We should only use the operations from the noexcept clause
    // to make sure we actually adhere to that contract.
    // NOLINTNEXTLINE: not returning *this for performance.
    return move_assign(
        std::move(that),
        typename AllocTraits::propagate_on_container_move_assignment());
  }